

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,Value *value,bool decl)

{
  FILE *__stream;
  undefined8 uVar1;
  ValueKind VVar2;
  Argument *arg;
  Function *func;
  BinaryOperator *binop;
  UnaryOperator *uop;
  CallInst *call;
  BranchInst *br;
  FCmpInst *value_00;
  ICmpInst *value_01;
  ReturnInst *value_02;
  UndefValue *undef;
  ConstantInt *value_03;
  ConstantFP *value_04;
  BasicBlock *bb;
  PHINode *phi;
  CastInst *cast;
  SelectInst *cast_00;
  ExtractValueInst *ext;
  AllocaInst *alloca;
  GetElementPtrInst *ptr;
  LoadInst *ptr_00;
  StoreInst *ptr_01;
  AtomicRMWInst *atomic_op;
  AtomicCmpXchgInst *xchg;
  GlobalVariable *var;
  ConstantAggregateZero *zero;
  ConstantDataArray *arr;
  ConstantDataVector *vec;
  SwitchInst *branch;
  ShuffleVectorInst *shuf;
  ExtractElementInst *extr;
  InsertElementInst *inst;
  void *pvVar3;
  uint64_t local_1038;
  uint64_t local_1030;
  char local_1028 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  bool decl_local;
  Value *value_local;
  StreamState *this_local;
  
  VVar2 = Value::get_value_kind(value);
  switch(VVar2) {
  case Argument:
    arg = cast<LLVMBC::Argument>(value);
    append(this,arg,decl);
    break;
  case Function:
    func = cast<LLVMBC::Function>(value);
    append(this,func,decl);
    break;
  default:
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    __stream = _stderr;
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      VVar2 = Value::get_value_kind(value);
      fprintf(__stream,"[ERROR]: Unknown ValueKind %u.\n",(ulong)VVar2);
      fflush(_stderr);
    }
    else {
      VVar2 = Value::get_value_kind(value);
      snprintf(local_1028,0x1000,"Unknown ValueKind %u.\n",(ulong)VVar2);
      uVar1 = buffer._4088_8_;
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar3,2,local_1028);
    }
    if (decl) {
      local_1030 = Value::get_tween_id(value);
      append<char_const(&)[2],unsigned_long,char_const(&)[17]>
                (this,(char (*) [2])0x2a90be,&local_1030,(char (*) [17])" = unimplemented");
    }
    else {
      local_1038 = Value::get_tween_id(value);
      append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_1038);
    }
    break;
  case ConstantInt:
    value_03 = cast<LLVMBC::ConstantInt>(value);
    append(this,value_03,decl);
    break;
  case ConstantFP:
    value_04 = cast<LLVMBC::ConstantFP>(value);
    append(this,value_04,decl);
    break;
  case ConstantAggregateZero:
    zero = cast<LLVMBC::ConstantAggregateZero>(value);
    append(this,zero,decl);
    break;
  case ConstantDataArray:
    arr = cast<LLVMBC::ConstantDataArray>(value);
    append(this,arr,decl);
    break;
  case ConstantDataVector:
    vec = cast<LLVMBC::ConstantDataVector>(value);
    append(this,vec,decl);
    break;
  case Undef:
    undef = cast<LLVMBC::UndefValue>(value);
    append(this,undef,decl);
    break;
  case UnaryOperator:
    uop = cast<LLVMBC::UnaryOperator>(value);
    append(this,uop,decl);
    break;
  case BinaryOperator:
    binop = cast<LLVMBC::BinaryOperator>(value);
    append(this,binop,decl);
    break;
  case Call:
    call = cast<LLVMBC::CallInst>(value);
    append(this,call,decl);
    break;
  case FCmp:
    value_00 = cast<LLVMBC::FCmpInst>(value);
    append(this,value_00,decl);
    break;
  case ICmp:
    value_01 = cast<LLVMBC::ICmpInst>(value);
    append(this,value_01,decl);
    break;
  case BasicBlock:
    bb = cast<LLVMBC::BasicBlock>(value);
    append(this,bb,decl);
    break;
  case PHI:
    phi = cast<LLVMBC::PHINode>(value);
    append(this,phi,decl);
    break;
  case Cast:
    cast = cast<LLVMBC::CastInst>(value);
    append(this,cast,decl);
    break;
  case Select:
    cast_00 = cast<LLVMBC::SelectInst>(value);
    append(this,cast_00,decl);
    break;
  case ExtractValue:
    ext = cast<LLVMBC::ExtractValueInst>(value);
    append(this,ext,decl);
    break;
  case Alloca:
    alloca = cast<LLVMBC::AllocaInst>(value);
    append(this,alloca,decl);
    break;
  case GetElementPtr:
    ptr = cast<LLVMBC::GetElementPtrInst>(value);
    append(this,ptr,decl);
    break;
  case Load:
    ptr_00 = cast<LLVMBC::LoadInst>(value);
    append(this,ptr_00,decl);
    break;
  case Store:
    ptr_01 = cast<LLVMBC::StoreInst>(value);
    append(this,ptr_01,decl);
    break;
  case AtomicRMW:
    atomic_op = cast<LLVMBC::AtomicRMWInst>(value);
    append(this,atomic_op,decl);
    break;
  case AtomicCmpXchg:
    xchg = cast<LLVMBC::AtomicCmpXchgInst>(value);
    append(this,xchg,decl);
    break;
  case Return:
    value_02 = cast<LLVMBC::ReturnInst>(value);
    append(this,value_02,decl);
    break;
  case Branch:
    br = cast<LLVMBC::BranchInst>(value);
    append(this,br,decl);
    break;
  case Switch:
    branch = cast<LLVMBC::SwitchInst>(value);
    append(this,branch,decl);
    break;
  case Global:
    var = cast<LLVMBC::GlobalVariable>(value);
    append(this,var,decl);
    break;
  case ShuffleVector:
    shuf = cast<LLVMBC::ShuffleVectorInst>(value);
    append(this,shuf,decl);
    break;
  case ExtractElement:
    extr = cast<LLVMBC::ExtractElementInst>(value);
    append(this,extr,decl);
    break;
  case InsertElement:
    inst = cast<LLVMBC::InsertElementInst>(value);
    append(this,inst,decl);
  }
  return;
}

Assistant:

void StreamState::append(Value *value, bool decl)
{
	switch (value->get_value_kind())
	{
	case ValueKind::Argument:
		return append(cast<Argument>(value), decl);
	case ValueKind::Function:
		return append(cast<Function>(value), decl);
	case ValueKind::BinaryOperator:
		return append(cast<BinaryOperator>(value), decl);
	case ValueKind::UnaryOperator:
		return append(cast<UnaryOperator>(value), decl);
	case ValueKind::Call:
		return append(cast<CallInst>(value), decl);
	case ValueKind::Branch:
		return append(cast<BranchInst>(value), decl);
	case ValueKind::FCmp:
		return append(cast<FCmpInst>(value), decl);
	case ValueKind::ICmp:
		return append(cast<ICmpInst>(value), decl);
	case ValueKind::Return:
		return append(cast<ReturnInst>(value), decl);
	case ValueKind::Undef:
		return append(cast<UndefValue>(value), decl);
	case ValueKind::ConstantInt:
		return append(cast<ConstantInt>(value), decl);
	case ValueKind::ConstantFP:
		return append(cast<ConstantFP>(value), decl);
	case ValueKind::BasicBlock:
		return append(cast<BasicBlock>(value), decl);
	case ValueKind::PHI:
		return append(cast<PHINode>(value), decl);
	case ValueKind::Cast:
		return append(cast<CastInst>(value), decl);
	case ValueKind::Select:
		return append(cast<SelectInst>(value), decl);
	case ValueKind::ExtractValue:
		return append(cast<ExtractValueInst>(value), decl);
	case ValueKind::Alloca:
		return append(cast<AllocaInst>(value), decl);
	case ValueKind::GetElementPtr:
		return append(cast<GetElementPtrInst>(value), decl);
	case ValueKind::Load:
		return append(cast<LoadInst>(value), decl);
	case ValueKind::Store:
		return append(cast<StoreInst>(value), decl);
	case ValueKind::AtomicRMW:
		return append(cast<AtomicRMWInst>(value), decl);
	case ValueKind::AtomicCmpXchg:
		return append(cast<AtomicCmpXchgInst>(value), decl);
	case ValueKind::Global:
		return append(cast<GlobalVariable>(value), decl);
	case ValueKind::ConstantAggregateZero:
		return append(cast<ConstantAggregateZero>(value), decl);
	case ValueKind::ConstantDataArray:
		return append(cast<ConstantDataArray>(value), decl);
	case ValueKind::ConstantDataVector:
		return append(cast<ConstantDataVector>(value), decl);
	case ValueKind::Switch:
		return append(cast<SwitchInst>(value), decl);
	case ValueKind::ShuffleVector:
		return append(cast<ShuffleVectorInst>(value), decl);
	case ValueKind::ExtractElement:
		return append(cast<ExtractElementInst>(value), decl);
	case ValueKind::InsertElement:
		return append(cast<InsertElementInst>(value), decl);
	default:
		break;
	}

	LOGE("Unknown ValueKind %u.\n", unsigned(value->get_value_kind()));

	if (decl)
		append("%", value->get_tween_id(), " = unimplemented");
	else
		append("%", value->get_tween_id());
}